

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  bool bVar1;
  string sStack_58;
  string local_38;
  
  bVar1 = Value::hasComment(root,commentBefore);
  if (bVar1) {
    Value::getComment_abi_cxx11_(&local_38,root,commentBefore);
    normalizeEOL(&sStack_58,&local_38);
    std::__cxx11::string::append((string *)&this->document_);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::append((char *)&this->document_);
  }
  return;
}

Assistant:

void 
StyledWriter::writeCommentBeforeValue( const Value &root )
{
   if ( !root.hasComment( commentBefore ) )
      return;
   document_ += normalizeEOL( root.getComment( commentBefore ) );
   document_ += "\n";
}